

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarExpandedBitDecoder.cpp
# Opt level: O0

string * ZXing::OneD::DataBar::DecodeAI013x0x1x_abi_cxx11_
                   (BitArrayView *bits,char *aiPrefix,char *dateCode)

{
  int iVar1;
  string *in_RDI;
  int year;
  int month;
  int day;
  int date;
  int weight;
  string *buffer;
  int in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  string local_e8 [32];
  string local_c8 [16];
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  string local_a8 [32];
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  string local_78 [32];
  string local_58 [16];
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  
  DecodeAI01GTIN_abi_cxx11_
            ((BitArrayView *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  std::__cxx11::string::append((char *)in_RDI);
  iVar1 = BitArrayView::readBits
                    ((BitArrayView *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                     in_stack_fffffffffffffefc);
  std::__cxx11::to_string(in_stack_ffffffffffffff4c);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string(local_58);
  ToString<int,void>(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string(local_78);
  local_7c = BitArrayView::readBits
                       ((BitArrayView *)CONCAT44(iVar1,in_stack_ffffffffffffff00),
                        in_stack_fffffffffffffefc);
  if (local_7c != 0x9600) {
    std::__cxx11::string::append((char *)in_RDI);
    local_80 = local_7c % 0x20;
    if (local_7c < 0) {
      local_7c = local_7c + 0x1f;
    }
    local_88 = local_7c >> 5;
    local_84 = local_88 +
               (((uint)(local_88 / 6 + (local_7c >> 0x1f)) >> 1) - (local_7c >> 0x1f)) * -0xc + 1;
    local_88 = local_88 / 0xc;
    local_7c = local_88;
    ToString<int,void>(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    std::__cxx11::string::append((string *)in_RDI);
    std::__cxx11::string::~string(local_a8);
    ToString<int,void>(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    std::__cxx11::string::append((string *)in_RDI);
    std::__cxx11::string::~string(local_c8);
    ToString<int,void>(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    std::__cxx11::string::append((string *)in_RDI);
    std::__cxx11::string::~string(local_e8);
  }
  return in_RDI;
}

Assistant:

static std::string DecodeAI013x0x1x(BitArrayView& bits, const char* aiPrefix, const char* dateCode)
{
	std::string buffer = DecodeAI01GTIN(bits);
	buffer.append(aiPrefix);

	int weight = bits.readBits(20);
	buffer.append(std::to_string(weight / 100000));
	buffer.append(ToString(weight % 100000, 6));

	int date = bits.readBits(16);
	if (date != 38400) {
		buffer.append(dateCode);

		int day = date % 32;
		date /= 32;
		int month = date % 12 + 1;
		date /= 12;
		int year = date;

		buffer.append(ToString(year, 2));
		buffer.append(ToString(month, 2));
		buffer.append(ToString(day, 2));
	}

	return buffer;
}